

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceRule6Test::verifyResultData
          (TessellationShaderInvarianceRule6Test *this,void **all_iterations_data)

{
  ostringstream *poVar1;
  float *value;
  ostringstream *this_00;
  float fVar2;
  uint uVar3;
  pointer p_Var4;
  float *value_00;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  _test_iterations *p_Var8;
  bool bVar9;
  ulong uVar10;
  MessageBuilder *pMVar11;
  TestError *this_01;
  ulong uVar12;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  undefined8 extraout_RDX_00;
  ulong uVar14;
  int iVar15;
  float *tessellated_vertex_data;
  float *tessellated_vertex_data_00;
  float *tessellated_vertex_data_01;
  ulong uVar16;
  long lVar17;
  _tessellation_primitive_mode primitive_mode;
  string primitive_mode_str;
  undefined1 local_1b0 [384];
  
  uVar10 = 0;
  do {
    lVar17 = 0x2e0;
    iVar15 = (int)uVar10;
    primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
    p_Var8 = &this->m_test_triangles_iterations;
    if (iVar15 != 0) {
      if (iVar15 == 2) {
        return;
      }
      uVar10 = ((long)(this->m_test_triangles_iterations).
                      super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_test_triangles_iterations).
                     super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x24;
      lVar17 = 0x2f8;
      primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
      p_Var8 = &this->m_test_quads_iterations;
    }
    p_Var4 = (p_Var8->
             super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    value_00 = *(float **)
                ((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                        super_TestCase.super_TestNode._vptr_TestNode + lVar17);
    fVar2 = value_00[8];
    pvVar5 = all_iterations_data[uVar10 & 0xffffffff];
    for (uVar16 = 1; uVar16 < (((long)p_Var4 - (long)value_00) / 0x24 & 0xffffffffU);
        uVar16 = uVar16 + 1) {
      lVar6 = *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase
                               .super_TestCase.super_TestNode._vptr_TestNode + lVar17);
      value = (float *)(lVar6 + uVar16 * 0x24);
      pvVar7 = all_iterations_data[(uint)((int)uVar10 + (int)uVar16)];
      uVar3 = *(uint *)(lVar6 + 0x20 + uVar16 * 0x24);
      for (uVar14 = 0; uVar14 != (ulong)(uint)fVar2 / 3; uVar14 = uVar14 + 1) {
        uVar12 = (ulong)(uint)((int)uVar14 * 9);
        tessellated_vertex_data = (float *)(uVar12 * 4 + (long)pvVar5);
        bVar9 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,tessellated_vertex_data);
        if (!bVar9) {
          tessellated_vertex_data_00 = (float *)(uVar12 * 4 + 0xc + (long)pvVar5);
          bVar9 = TessellationShaderUtils::isOuterEdgeVertex
                            (primitive_mode,tessellated_vertex_data_00);
          if (!bVar9) {
            tessellated_vertex_data_01 = (float *)(uVar12 * 4 + 0x18 + (long)pvVar5);
            bVar9 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode,tessellated_vertex_data_01);
            if (!bVar9) {
              uVar12 = 0;
              uVar13 = extraout_RDX;
              do {
                if (((ulong)uVar3 / 3) * 9 + 9 == uVar12 + 9) {
                  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                            (&primitive_mode_str,(TessellationShaderUtils *)(ulong)(uint)value_00[6]
                             ,(_tessellation_primitive_mode)uVar13);
                  local_1b0._0_8_ =
                       ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                        super_TestCase.super_TestNode.m_testCtx)->m_log;
                  this_00 = (ostringstream *)(local_1b0 + 8);
                  std::__cxx11::ostringstream::ostringstream(this_00);
                  std::operator<<((ostream *)this_00,"For primitive mode [");
                  std::operator<<((ostream *)this_00,(string *)&primitive_mode_str);
                  std::operator<<((ostream *)this_00,"]");
                  std::operator<<((ostream *)this_00,", base inner tessellation levels:");
                  std::operator<<((ostream *)this_00,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value_00 + 1);
                  poVar1 = &pMVar11->m_str;
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  ", base outer tessellation levels:");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value_00 + 2);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value_00 + 3);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value_00 + 4);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value_00 + 5);
                  poVar1 = &pMVar11->m_str;
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  ", reference inner tessellation levels:");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 1);
                  poVar1 = &pMVar11->m_str;
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  ", reference outer tessellation levels:");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 2);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 3);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 4);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 5);
                  poVar1 = &pMVar11->m_str;
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  ", the following triangle formed during base tessellation run was not found in reference run:"
                                 );
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data + 1);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data + 2);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,"]x");
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data_00);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data + 4);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data + 5);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,"]x");
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,"[");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data_01);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data + 7);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,tessellated_vertex_data + 8);
                  tcu::MessageBuilder::operator<<
                            (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(this_00);
                  this_01 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (this_01,"Implementation does not appear to be rule 6-conformant",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                             ,0x9d4);
                  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                }
                bVar9 = TessellationShaderUtils::isTriangleDefined
                                  (tessellated_vertex_data,
                                   (float *)((long)pvVar7 + (uVar12 & 0xffffffff) * 4));
                uVar12 = uVar12 + 9;
                uVar13 = extraout_RDX_00;
              } while (!bVar9);
            }
          }
        }
      }
    }
    uVar10 = (ulong)(iVar15 + 1);
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule6Test::verifyResultData(const void** all_iterations_data)
{
	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */

	for (unsigned int n_iteration = 0; n_iteration < 2 /* quads, triangles */; ++n_iteration)
	{
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();

		const unsigned int n_sets = (n_iteration == 0) ? (const unsigned int)m_test_triangles_iterations.size() :
														 (const unsigned int)m_test_quads_iterations.size();

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		const unsigned int n_triangles_in_base_set = test_iterations[0].n_vertices / 3 /* vertices per triangle */;

		DE_ASSERT(test_iterations.size() != 0);

		/* For each iteration, verify that all vertices generated for all three vertex spacing modes.
		 * are exactly the same (but in different order) */
		const _test_iteration& base_test		= test_iterations[0];
		const float*		   base_vertex_data = (const float*)all_iterations_data[n_base_iteration + 0];

		for (unsigned int n_set = 1; n_set < n_sets; ++n_set)
		{
			const _test_iteration& set_test		   = test_iterations[n_set];
			const float*		   set_vertex_data = (const float*)all_iterations_data[n_base_iteration + n_set];

			/* We're operating on triangles so make sure the amount of vertices we're dealing with is
			 * divisible by 3 */
			DE_ASSERT((test_iterations[n_set].n_vertices % 3) == 0);

			const unsigned int n_triangles_in_curr_set = test_iterations[n_set].n_vertices / 3;

			/* Take base triangles and make sure they can be found in iteration-specific set.
			 * Now, thing to keep in mind here is that we must not assume any specific vertex
			 * and triangle order which is why the slow search. */
			for (unsigned int n_base_triangle = 0; n_base_triangle < n_triangles_in_base_set; ++n_base_triangle)
			{
				/* Extract base triangle data first */
				const float* base_triangle_vertex1 = base_vertex_data +
													 n_base_triangle * 3 *		/* vertices per triangle */
														 3;						/* components */
				const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
				const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */

				/* Only interior triangles should be left intact. Is this an interior triangle? */
				if (!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1) &&
					!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2) &&
					!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3))
				{
					/* Iterate through all triangles in considered set */
					bool has_base_set_triangle_been_found = false;

					for (unsigned int n_curr_set_triangle = 0; n_curr_set_triangle < n_triangles_in_curr_set;
						 ++n_curr_set_triangle)
					{
						const float* curr_triangle = set_vertex_data +
													 n_curr_set_triangle * 3 * /* vertices per triangle */
														 3;					   /* components */

						if (TessellationShaderUtils::isTriangleDefined(base_triangle_vertex1, curr_triangle))
						{
							has_base_set_triangle_been_found = true;

							break;
						}
					} /* for (all triangles in currently processed set) */

					if (!has_base_set_triangle_been_found)
					{
						std::string primitive_mode_str =
							TessellationShaderUtils::getESTokenForPrimitiveMode(base_test.primitive_mode);

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "]"
							<< ", base inner tessellation levels:"
							<< "[" << base_test.inner_tess_levels[0] << ", " << base_test.inner_tess_levels[1] << "]"
							<< ", base outer tessellation levels:"
							<< "[" << base_test.outer_tess_levels[0] << ", " << base_test.outer_tess_levels[1] << ", "
							<< base_test.outer_tess_levels[2] << ", " << base_test.outer_tess_levels[3] << "]"
							<< ", reference inner tessellation levels:"
							<< "[" << set_test.inner_tess_levels[0] << ", " << set_test.inner_tess_levels[1] << "]"
							<< ", reference outer tessellation levels:"
							<< "[" << set_test.outer_tess_levels[0] << ", " << set_test.outer_tess_levels[1] << ", "
							<< set_test.outer_tess_levels[2] << ", " << set_test.outer_tess_levels[3] << "]"
							<< ", the following triangle formed during base tessellation run was not found in "
							   "reference run:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2]

							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation does not appear to be rule 6-conformant");
					} /* if (triangle created during base run was not found in reference run) */
				}	 /* if (base triangle is interior) */
			}		  /* for (all base set's vertices) */
		}			  /* for (all sets) */
	}				  /* for (both primitive types) */
}